

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::CharacterClassPass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ulong uVar4;
  EncodedChar *pEVar5;
  codepoint_t cVar6;
  EncodedChar *pEVar7;
  codepoint_t cVar8;
  codepoint_t codePointValue;
  EncodedChar EVar9;
  uint uVar10;
  codepoint_t codePointValue_00;
  EncodedChar *location;
  char16 local_40;
  EncodedChar local_3e;
  char16 local_3c;
  char16 local_3a;
  char16 ignore;
  Char outChar;
  char16 leftSingleChar;
  char16 rightSingleChar;
  bool previousSurrogatePart;
  
  pEVar5 = this->inputLim;
  location = this->next;
  if (pEVar5 < location) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00eb88e1;
    *puVar3 = 0;
    pEVar5 = this->inputLim;
    location = this->next;
  }
  if (*location == L'^') {
    if (pEVar5 < location + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar2) goto LAB_00eb88e1;
      *puVar3 = 0;
      pEVar5 = this->inputLim;
      location = this->next;
    }
    location = location + 1;
    this->next = location;
  }
  if (pEVar5 < location) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar2) goto LAB_00eb88e1;
    *puVar3 = 0;
    location = this->next;
  }
  EVar9 = *location;
  rightSingleChar._1_1_ = '\0';
  if (EVar9 != L']') {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    _ignore = 0xffffffff;
    codePointValue = 0xffffffff;
    cVar8 = 0xffffffff;
    do {
      uVar10 = (uint)(ushort)EVar9;
      if (EVar9 == L'\0') {
        pEVar5 = this->inputLim;
        if (pEVar5 <= location) {
          Fail(this,-0x7ff5ec65);
          return;
        }
LAB_00eb823c:
        pEVar7 = location;
        if (pEVar5 <= location) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar2) goto LAB_00eb88e1;
          *puVar3 = 0;
          pEVar7 = this->next;
          uVar10 = (uint)(ushort)*pEVar7;
        }
        this->next = pEVar7 + 1;
        if (uVar10 < 0x100) {
          if ((ASCIIChars::classes[uVar10] & 2) != 0) {
LAB_00eb82cb:
            Fail(this,-0x7ff5fc0c);
          }
        }
        else if ((uVar10 & 0xfffe) == 0x2028) goto LAB_00eb82cb;
        cVar8 = uVar10;
        if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
          TrackIfSurrogatePair
                    (this,uVar10,location,(uint32)((ulong)((long)this->next - (long)location) >> 1))
          ;
        }
      }
      else if (uVar10 == 0x2d) {
        if ((codePointValue == 0xffffffff) && (cVar8 != 0xffffffff)) {
          if (location == this->positionAfterLastSurrogate) {
            cVar8 = this->valueOfLastSurrogate;
          }
          if (location < this->inputLim) {
            this->next = location + 1;
            uVar4 = 0x2d;
LAB_00eb84c5:
            if ((ASCIIChars::classes[uVar4] & 2) != 0) {
LAB_00eb84db:
              Fail(this,-0x7ff5fc0c);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x25d,"(!IsEOF())","!IsEOF()");
            if (!bVar2) goto LAB_00eb88e1;
            *puVar3 = 0;
            EVar9 = *this->next;
            uVar4 = (ulong)(ushort)EVar9;
            this->next = this->next + 1;
            if ((ushort)EVar9 < 0x100) goto LAB_00eb84c5;
            if ((EVar9 & 0xfffeU) == 0x2028) goto LAB_00eb84db;
          }
          codePointValue = cVar8;
          cVar8 = 0xffffffff;
        }
        else if (location < this->inputLim) {
          this->next = location + 1;
          uVar4 = 0x2d;
LAB_00eb8441:
          cVar8 = (codepoint_t)uVar4;
          uVar10 = cVar8;
          if ((ASCIIChars::classes[uVar4] & 2) != 0) {
LAB_00eb8452:
            cVar8 = uVar10;
            Fail(this,-0x7ff5fc0c);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar2) goto LAB_00eb88e1;
          *puVar3 = 0;
          EVar9 = *this->next;
          uVar4 = (ulong)(ushort)EVar9;
          cVar8 = (codepoint_t)(ushort)EVar9;
          this->next = this->next + 1;
          if ((ushort)EVar9 < 0x100) goto LAB_00eb8441;
          uVar10 = (uint)(ushort)EVar9;
          if ((EVar9 & 0xfffeU) == 0x2028) goto LAB_00eb8452;
        }
        this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
        if (rightSingleChar._1_1_ == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x7d6,"(!previousSurrogatePart)","!previousSurrogatePart");
          if (!bVar2) goto LAB_00eb88e1;
          *puVar3 = 0;
        }
      }
      else {
        if (uVar10 != 0x5c) {
          pEVar5 = this->inputLim;
          goto LAB_00eb823c;
        }
        if (location < this->inputLim) {
          this->next = location + 1;
          uVar4 = 0x5c;
LAB_00eb8389:
          EVar9 = (EncodedChar)uVar4;
          if ((ASCIIChars::classes[uVar4] & 2) != 0) {
LAB_00eb839a:
            Fail(this,-0x7ff5fc0c);
          }
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar2) goto LAB_00eb88e1;
          *puVar3 = 0;
          EVar9 = *this->next;
          uVar4 = (ulong)(ushort)EVar9;
          this->next = this->next + 1;
          if ((ushort)EVar9 < 0x100) goto LAB_00eb8389;
          if ((EVar9 & 0xfffeU) == 0x2028) goto LAB_00eb839a;
        }
        local_3e = EVar9;
        bVar2 = ClassEscapePass0(this,&local_3e,(bool *)((long)&rightSingleChar + 1));
        cVar6 = codePointValue;
        if (_ignore == 0xffffffff) {
          cVar6 = 0xffffffff;
        }
        cVar8 = (codepoint_t)(ushort)local_3e;
        if (!bVar2) {
          cVar8 = 0xffffffff;
          codePointValue = cVar6;
        }
      }
      if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
        cVar6 = _ignore;
        if ((codePointValue != 0xffffffff) && (cVar8 != 0xffffffff)) {
          if (0xffff < codePointValue) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e7,"(pendingRangeStart < 0x10000)","pendingRangeStart < 0x10000")
            ;
            if (!bVar2) goto LAB_00eb88e1;
            *puVar3 = 0;
          }
          if (_ignore != 0xffffffff) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0x7e8,"(pendingRangeEnd == INVALID_CODEPOINT)",
                               "pendingRangeEnd == INVALID_CODEPOINT");
            if (!bVar2) goto LAB_00eb88e1;
            *puVar3 = 0;
          }
          if (cVar8 < codePointValue) {
            Fail(this,-0x7ff5ec63);
          }
          cVar8 = 0xffffffff;
          goto LAB_00eb86b1;
        }
      }
      else if (codePointValue == 0xffffffff) {
LAB_00eb86b1:
        codePointValue = 0xffffffff;
        cVar6 = _ignore;
      }
      else {
        if ((cVar8 & _ignore) == 0xffffffff) {
          cVar8 = 0xffffffff;
        }
        else {
          pEVar5 = this->next;
          if (pEVar5 == this->positionAfterLastSurrogate) {
            codePointValue_00 = this->valueOfLastSurrogate;
            cVar8 = 0xffffffff;
            if (rightSingleChar._1_1_ == '\x01') {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x7f8,"(!previousSurrogatePart)","!previousSurrogatePart");
              if (!bVar2) goto LAB_00eb88e1;
              *puVar3 = 0;
            }
          }
          else {
            if (this->inputLim < pEVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar3 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
              if (!bVar2) goto LAB_00eb88e1;
              *puVar3 = 0;
              pEVar5 = this->next;
            }
            codePointValue_00 = _ignore;
            if (_ignore == 0xffffffff) {
              codePointValue_00 = cVar8;
            }
            if (*pEVar5 != L']') {
              codePointValue_00 = _ignore;
            }
          }
          cVar6 = cVar8;
          if (codePointValue_00 == 0xffffffff) goto LAB_00eb87d8;
          if (codePointValue < 0x10000) {
            local_3c = (char16)codePointValue;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue,&local_40,&local_3c);
          }
          if (codePointValue_00 < 0x10000) {
            local_3a = (char16)codePointValue_00;
          }
          else {
            Js::NumberUtilities::CodePointAsSurrogatePair(codePointValue_00,&local_3a,&local_40);
          }
          if ((codePointValue_00 < codePointValue) &&
             ((codePointValue_00 | codePointValue) < 0x10000)) {
            Fail(this,-0x7ff5ec63);
          }
          else {
            if ((ushort)local_3a < (ushort)local_3c) {
              DeferredFailIfNotUnicode(this,-0x7ff5ec63);
            }
            if (codePointValue_00 < codePointValue) {
              DeferredFailIfUnicode(this,-0x7ff5ec63);
            }
          }
          codePointValue = 0xffffffff;
        }
        _ignore = 0xffffffff;
        cVar6 = _ignore;
      }
LAB_00eb87d8:
      _ignore = cVar6;
      location = this->next;
      if (this->inputLim < location) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar2) goto LAB_00eb88e1;
        *puVar3 = 0;
        location = this->next;
      }
      EVar9 = *location;
    } while (EVar9 != L']');
    if (_ignore != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x83a,"(pendingRangeEnd == INVALID_CODEPOINT)",
                         "pendingRangeEnd == INVALID_CODEPOINT");
      if (!bVar2) {
LAB_00eb88e1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  return;
}

Assistant:

void Parser<P, IsLiteral>::CharacterClassPass0()
    {
        // Could be terminating 0
        if (ECLookahead() == '^')
            ECConsume();

        EncodedChar nextChar = ECLookahead();
        const EncodedChar* current;
        codepoint_t lastCodepoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        codepoint_t pendingRangeEnd = INVALID_CODEPOINT;
        bool previousSurrogatePart = false;

        while(nextChar != ']')
        {
            current = next;

            if (nextChar == '\0' && IsEOF())
            {
                // Report as unclosed '['
                Fail(JSERR_RegExpNoBracket);
                return;
            } // Otherwise embedded '\0' is ok
            else if (nextChar == '\\')
            {
                // Consume, as classescapepass0 expects for it to be consumed
                Char outChar = NextChar();
                // If previousSurrogatePart = true upon leaving this method, then we are going to pass through here twice
                // This is because \u{} escape sequence was encountered that is actually 2 characters, the second time we will pass consuming entire character
                if (ClassEscapePass0(outChar, previousSurrogatePart))
                {
                    lastCodepoint = outChar;
                }
                else
                {
                    // Last codepoint isn't a singleton, so no codepoint tracking for the sake of ranges is needed.
                    lastCodepoint = INVALID_CODEPOINT;
                    // Unless we have a possible range end, cancel our range tracking.
                    if (pendingRangeEnd == INVALID_CODEPOINT)
                    {
                        pendingRangeStart = INVALID_CODEPOINT;
                    }
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || lastCodepoint == INVALID_CODEPOINT)
                {
                    // '-' is the upper part of the range, with pendingRangeStart codepoint is the lower. Set  lastCodePoint to '-' to check at the end of the while statement
                    // OR
                    // '-' is just a char, consume it and set as last char
                    lastCodepoint = NextChar();
                }
                else
                {
                    pendingRangeStart = this->next == this->positionAfterLastSurrogate
                        ? this->valueOfLastSurrogate
                        : lastCodepoint;
                    lastCodepoint = INVALID_CODEPOINT;
                    NextChar();
                }

                // If we have a pattern of the form [\ud800-\udfff], we need this to be interpreted as a range.
                // In order to achieve this, the two variables that we use to track surrogate pairs, namely
                // tempLocationOfSurrogatePair and previousSurrogatePart, need to be in a certain state.
                //
                // We need to reset tempLocationOfSurrogatePair as it points to the first Unicode escape (\ud800)
                // when we're here. We need to clear it in order not to have a surrogate pair when we process the
                // second escape (\udfff).
                //
                // previousSurrogatePart is used when we have a code point in the \u{...} extended format and the
                // character is in a supplementary plane. However, there is no need to change its value here. When
                // such an escape sequence is encountered, the first call to ClassEscapePass0() sets the variable
                // to true, but it rewinds the input back to the beginning of the escape sequence. The next
                // iteration of the loop here will again call ClassEscape0() with the same character and the
                // variable will this time be set to false. Therefore, the variable will always be false here.
                tempLocationOfSurrogatePair = nullptr;
                Assert(!previousSurrogatePart);
            }
            else
            {
                lastCodepoint = NextChar();

                if (scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                {
                    TrackIfSurrogatePair(lastCodepoint, current, (uint32)(next - current));
                }
            }

            if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
            {
                // This is much easier to handle.
                if (pendingRangeStart != INVALID_CODEPOINT && lastCodepoint != INVALID_CODEPOINT)
                {
                    Assert(pendingRangeStart < 0x10000);
                    Assert(pendingRangeEnd == INVALID_CODEPOINT);
                    if (pendingRangeStart > lastCodepoint)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    pendingRangeStart = lastCodepoint = INVALID_CODEPOINT;
                }
            }
            // We have a candidate for range end, and we have a range start.
            else if (pendingRangeStart != INVALID_CODEPOINT && (lastCodepoint != INVALID_CODEPOINT || pendingRangeEnd != INVALID_CODEPOINT))
            {
                // The following will be true at the end of each surrogate pair parse.
                // Note, the escape sequence \u{} is a two time parse, so this will be true on the second time around.
                if (this->next == this->positionAfterLastSurrogate)
                {
                    lastCodepoint = this->valueOfLastSurrogate;
                    Assert(!previousSurrogatePart);
                    pendingRangeEnd = lastCodepoint;

                    lastCodepoint = INVALID_CODEPOINT;
                }
                // If the next character is the end of range ']', then we can't have a surrogate pair.
                // The current character is the range end, if we don't already have a candidate.
                else if (ECLookahead() == ']' && pendingRangeEnd == INVALID_CODEPOINT)
                {
                    pendingRangeEnd = lastCodepoint;
                }

                //If we get here, and pendingRangeEnd is set. Then one of the above has caused it to be set, or the previous iteration of the loop.
                if (pendingRangeEnd != INVALID_CODEPOINT)
                {
                    char16 leftSingleChar, rightSingleChar, ignore;

                    if (pendingRangeStart >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeStart, &ignore, &leftSingleChar);
                    }
                    else
                    {
                        leftSingleChar = (char16)pendingRangeStart;
                    }

                    if (pendingRangeEnd >= 0x10000)
                    {
                        Js::NumberUtilities::CodePointAsSurrogatePair(pendingRangeEnd, &rightSingleChar, &ignore);
                    }
                    else
                    {
                        rightSingleChar = (char16)pendingRangeEnd;
                    }

                    // Here it is a bit tricky, we don't know if we have a unicode option specified.
                    // If it is, then \ud800\udc00 - \ud800\udc01 is valid, otherwise invalid.
                    if (pendingRangeStart < 0x10000 && pendingRangeEnd < 0x10000 && pendingRangeStart > pendingRangeEnd)
                    {
                        Fail(JSERR_RegExpBadRange);
                    }
                    else
                    {
                        if(leftSingleChar > rightSingleChar)
                        {
                            DeferredFailIfNotUnicode(JSERR_RegExpBadRange);
                        }

                        if (pendingRangeStart > pendingRangeEnd)
                        {
                            DeferredFailIfUnicode(JSERR_RegExpBadRange);
                        }
                    }

                    pendingRangeStart = pendingRangeEnd = INVALID_CODEPOINT;
                }
                // The current char < 0x10000 is a candidate for the range end, but we need to iterate one more time.
                else
                {
                    pendingRangeEnd = lastCodepoint;
                }
            }
            nextChar = ECLookahead();
        }

        // We should never have a pendingRangeEnd set when we exit the loop
        Assert(pendingRangeEnd == INVALID_CODEPOINT);
    }